

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yacclab_tests.cc
# Opt level: O3

bool __thiscall
YacclabTests::SaveBroadOutputResults
          (YacclabTests *this,Mat1d *results,string *o_filename,Mat1i *labels,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          *filenames,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *ccl_algorithms)

{
  pointer pbVar1;
  ostream *poVar2;
  pointer ppVar3;
  pointer ppVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *algo_name;
  pointer pbVar6;
  ulong uVar7;
  uint uVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  ofstream os;
  char local_23a;
  char local_239;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *local_238;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_238 = filenames;
  std::ofstream::ofstream(&local_230,(string *)o_filename,_S_out);
  local_239 = std::__basic_file<char>::is_open();
  if (local_239 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#",1);
    pbVar6 = (ccl_algorithms->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (ccl_algorithms->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar6 != pbVar1) {
      do {
        local_23a = '\t';
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,&local_23a,1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2,(pbVar6->_M_dataplus)._M_p,pbVar6->_M_string_length);
        pbVar6 = pbVar6 + 1;
      } while (pbVar6 != pbVar1);
    }
    local_23a = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,&local_23a,1);
    ppVar3 = (local_238->
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    ppVar4 = (local_238->
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar4 != ppVar3) {
      uVar7 = 0;
      do {
        if (ppVar3[uVar7].second == true) {
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_230,ppVar3[uVar7].first._M_dataplus._M_p,
                              ppVar3[uVar7].first._M_string_length);
          local_23a = '\t';
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_23a,1);
          if ((ccl_algorithms->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish !=
              (ccl_algorithms->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start) {
            uVar8 = 1;
            do {
              poVar2 = std::ostream::_M_insert<double>
                                 (*(double *)
                                   (**(long **)&results->field_0x48 * (long)(int)uVar7 +
                                    *(long *)&results->field_0x10 + (long)(int)(uVar8 - 1) * 8));
              local_23a = '\t';
              std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_23a,1);
              uVar5 = (ulong)uVar8;
              uVar8 = uVar8 + 1;
            } while (uVar5 < (ulong)((long)(ccl_algorithms->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(ccl_algorithms->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start >> 5));
          }
          local_23a = '\n';
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,&local_23a,1);
          ppVar3 = (local_238->
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          ppVar4 = (local_238->
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        uVar7 = (ulong)((int)uVar7 + 1);
        uVar5 = ((long)ppVar4 - (long)ppVar3 >> 3) * -0x3333333333333333;
      } while (uVar7 <= uVar5 && uVar5 - uVar7 != 0);
    }
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _operator__;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return (bool)local_239;
}

Assistant:

bool YacclabTests::SaveBroadOutputResults(const cv::Mat1d& results, const std::string& o_filename, const cv::Mat1i& labels,
    const std::vector<std::pair<std::string, bool>>& filenames, const std::vector<std::string>& ccl_algorithms) {
    std::ofstream os(o_filename);
    if (!os.is_open()) {
        return false;
    }

    // To set heading file format
    os << "#";
    for (const auto& algo_name : ccl_algorithms) {
        os << '\t' << algo_name;
    }
    os << '\n';
    // To set heading file format

    for (unsigned files = 0; files < filenames.size(); ++files) {
        if (filenames[files].second) {
            os << filenames[files].first << '\t';
            for (unsigned i = 0; i < ccl_algorithms.size(); ++i) {
                os << results(files, i) << '\t';

            }
            os << '\n';
        }
    }
    return true;
}